

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O1

float __thiscall indk::Position::getDistanceFrom(Position *this,Position *P)

{
  uint uVar1;
  Error *this_00;
  ulong uVar2;
  float fVar3;
  float fVar4;
  
  uVar1 = this->DimensionsCount;
  if (uVar1 != P->DimensionsCount) {
    this_00 = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(this_00,10);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  fVar3 = 0.0;
  if ((ulong)uVar1 != 0) {
    uVar2 = 0;
    do {
      fVar4 = -1.0;
      if (uVar2 < P->DimensionsCount) {
        fVar4 = P->X[uVar2];
      }
      fVar4 = this->X[uVar2] - fVar4;
      fVar3 = fVar3 + fVar4 * fVar4;
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  if (0.0 <= fVar3) {
    return SQRT(fVar3);
  }
  fVar3 = sqrtf(fVar3);
  return fVar3;
}

Assistant:

float indk::Position::getDistanceFrom(const indk::Position *P) {
    if (DimensionsCount != P->getDimensionsCount()) {
        throw indk::Error(indk::Error::EX_POSITION_DIMENSIONS);
    }
    float D = 0, CValue;
    for (unsigned int i = 0; i < DimensionsCount; i++) {
        CValue = X[i] - P -> getPositionValue(i);
        D += CValue * CValue;
    }
    return sqrt(D);
}